

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

TextureMapping2DHandle __thiscall
pbrt::TextureMapping2DHandle::Create
          (TextureMapping2DHandle *this,ParameterDictionary *parameters,Transform *renderFromTexture
          ,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uintptr_t iptr;
  undefined4 extraout_var;
  ulong uVar5;
  undefined8 *puVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UVMapping2D *pUVar7;
  Float FVar8;
  Float FVar9;
  undefined8 uVar10;
  Vector3f VVar11;
  Vector3f VVar12;
  allocator<char> local_184;
  allocator<char> local_183;
  allocator<char> local_182;
  allocator<char> local_181;
  Float local_180;
  Float local_17c;
  string local_178;
  Float local_158;
  float fStack_154;
  undefined8 uStack_150;
  Float local_148;
  float fStack_144;
  undefined8 uStack_140;
  string local_138;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  string type;
  Allocator alloc_local;
  string local_88;
  string local_68;
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_38;
  undefined4 extraout_var_00;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"mapping",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"uv",(allocator<char> *)&local_88);
  ParameterDictionary::GetOneString(&type,parameters,&local_138,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  bVar3 = std::operator==(&type,"uv");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"uscale",(allocator<char> *)&local_178);
    local_148 = ParameterDictionary::GetOneFloat(parameters,&local_138,1.0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"vscale",(allocator<char> *)&local_178);
    FVar8 = ParameterDictionary::GetOneFloat(parameters,&local_138,1.0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"udelta",(allocator<char> *)&local_178);
    local_158 = ParameterDictionary::GetOneFloat(parameters,&local_138,0.0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"vdelta",(allocator<char> *)&local_178);
    FVar9 = ParameterDictionary::GetOneFloat(parameters,&local_138,0.0);
    std::__cxx11::string::~string((string *)&local_138);
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,4);
    pUVar7 = (UVMapping2D *)CONCAT44(extraout_var,iVar4);
    pUVar7->su = local_148;
    pUVar7->sv = FVar8;
    pUVar7->du = local_158;
    pUVar7->dv = FVar9;
LAB_002d1245:
    uVar5 = (ulong)pUVar7 | 0x1000000000000;
  }
  else {
    bVar3 = std::operator==(&type,"spherical");
    if (!bVar3) {
      bVar3 = std::operator==(&type,"cylindrical");
      if (bVar3) {
        local_138._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
        local_138._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
        local_138.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
        local_138.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
        uStack_118 = *(undefined8 *)(renderFromTexture->mInv).m[2];
        uStack_110 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
        uStack_108 = *(undefined8 *)(renderFromTexture->mInv).m[3];
        uStack_100 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
        local_f8 = *(undefined8 *)(renderFromTexture->m).m[0];
        uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
        uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[1];
        uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
        uStack_d8 = *(undefined8 *)(renderFromTexture->m).m[2];
        uStack_d0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
        uStack_c8 = *(undefined8 *)(renderFromTexture->m).m[3];
        uStack_c0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
        puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar4);
        puVar6[8] = local_f8;
        puVar6[9] = uStack_f0;
        puVar6[10] = uStack_e8;
        puVar6[0xb] = uStack_e0;
        puVar6[0xc] = uStack_d8;
        puVar6[0xd] = uStack_d0;
        puVar6[0xe] = uStack_c8;
        puVar6[0xf] = uStack_c0;
        *puVar6 = local_138._M_dataplus._M_p;
        puVar6[1] = local_138._M_string_length;
        puVar6[2] = local_138.field_2._M_allocated_capacity;
        puVar6[3] = local_138.field_2._8_8_;
        puVar6[4] = uStack_118;
        puVar6[5] = uStack_110;
        puVar6[6] = uStack_108;
        puVar6[7] = uStack_100;
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)puVar6 | 0x3000000000000;
        goto LAB_002d12cb;
      }
      bVar3 = std::operator==(&type,"planar");
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"v1",&local_181);
        uVar10 = 0;
        local_38._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
        local_38.z = 0.0;
        VVar11 = ParameterDictionary::GetOneVector3f(parameters,&local_138,(Vector3f *)&local_38);
        local_148 = VVar11.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_144 = VVar11.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_140 = uVar10;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"v2",&local_182);
        uVar10 = 0;
        local_48.x = 0.0;
        local_48.y = 1.0;
        local_48.z = 0.0;
        VVar12 = ParameterDictionary::GetOneVector3f(parameters,&local_178,(Vector3f *)&local_48);
        local_158 = VVar12.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_154 = VVar12.super_Tuple3<pbrt::Vector3,_float>.y;
        uStack_150 = uVar10;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"udelta",&local_183);
        local_17c = ParameterDictionary::GetOneFloat(parameters,&local_68,0.0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"vdelta",&local_184);
        local_180 = ParameterDictionary::GetOneFloat(parameters,&local_88,0.0);
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,4);
        puVar6 = (undefined8 *)CONCAT44(extraout_var_02,iVar4);
        auVar2._4_4_ = fStack_144;
        auVar2._0_4_ = local_148;
        auVar2._8_8_ = uStack_140;
        auVar1._4_4_ = fStack_154;
        auVar1._0_4_ = local_158;
        auVar1._8_8_ = uStack_150;
        uVar10 = vmovlps_avx(auVar2);
        *puVar6 = uVar10;
        *(float *)(puVar6 + 1) = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar10 = vmovlps_avx(auVar1);
        *(undefined8 *)((long)puVar6 + 0xc) = uVar10;
        *(float *)((long)puVar6 + 0x14) = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
        *(Float *)(puVar6 + 3) = local_17c;
        *(Float *)((long)puVar6 + 0x1c) = local_180;
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)puVar6 | 0x4000000000000;
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_138);
        goto LAB_002d12cb;
      }
      Error<std::__cxx11::string&>(loc,"2D texture mapping \"%s\" unknown",&type);
      pUVar7 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::UVMapping2D>
                         (&alloc_local);
      goto LAB_002d1245;
    }
    local_138._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
    local_138._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
    local_138.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
    local_138.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
    uStack_118 = *(undefined8 *)(renderFromTexture->mInv).m[2];
    uStack_110 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
    uStack_108 = *(undefined8 *)(renderFromTexture->mInv).m[3];
    uStack_100 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
    local_f8 = *(undefined8 *)(renderFromTexture->m).m[0];
    uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
    uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[1];
    uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
    uStack_d8 = *(undefined8 *)(renderFromTexture->m).m[2];
    uStack_d0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
    uStack_c8 = *(undefined8 *)(renderFromTexture->m).m[3];
    uStack_c0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
    puVar6 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
    puVar6[8] = local_f8;
    puVar6[9] = uStack_f0;
    puVar6[10] = uStack_e8;
    puVar6[0xb] = uStack_e0;
    puVar6[0xc] = uStack_d8;
    puVar6[0xd] = uStack_d0;
    puVar6[0xe] = uStack_c8;
    puVar6[0xf] = uStack_c0;
    *puVar6 = local_138._M_dataplus._M_p;
    puVar6[1] = local_138._M_string_length;
    puVar6[2] = local_138.field_2._M_allocated_capacity;
    puVar6[3] = local_138.field_2._8_8_;
    puVar6[4] = uStack_118;
    puVar6[5] = uStack_110;
    puVar6[6] = uStack_108;
    puVar6[7] = uStack_100;
    uVar5 = (ulong)puVar6 | 0x2000000000000;
  }
  (this->
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  ).bits = uVar5;
LAB_002d12cb:
  std::__cxx11::string::~string((string *)&type);
  return (TextureMapping2DHandle)
         (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          )this;
}

Assistant:

TextureMapping2DHandle TextureMapping2DHandle::Create(
    const ParameterDictionary &parameters, const Transform &renderFromTexture,
    const FileLoc *loc, Allocator alloc) {
    std::string type = parameters.GetOneString("mapping", "uv");
    if (type == "uv") {
        Float su = parameters.GetOneFloat("uscale", 1.);
        Float sv = parameters.GetOneFloat("vscale", 1.);
        Float du = parameters.GetOneFloat("udelta", 0.);
        Float dv = parameters.GetOneFloat("vdelta", 0.);
        return alloc.new_object<UVMapping2D>(su, sv, du, dv);
    } else if (type == "spherical")
        return alloc.new_object<SphericalMapping2D>(Inverse(renderFromTexture));
    else if (type == "cylindrical")
        return alloc.new_object<CylindricalMapping2D>(Inverse(renderFromTexture));
    else if (type == "planar")
        return alloc.new_object<PlanarMapping2D>(
            parameters.GetOneVector3f("v1", Vector3f(1, 0, 0)),
            parameters.GetOneVector3f("v2", Vector3f(0, 1, 0)),
            parameters.GetOneFloat("udelta", 0.f), parameters.GetOneFloat("vdelta", 0.f));
    else {
        Error(loc, "2D texture mapping \"%s\" unknown", type);
        return alloc.new_object<UVMapping2D>();
    }
}